

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_2i_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                  uint32_t oprsz,uint32_t tysz,TCGType_conflict type,int64_t c,_Bool load_dest,
                  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_int64_t_conflict9 *fni)

{
  TCGv_vec arg;
  TCGv_vec arg_00;
  uint local_3c;
  uint32_t i;
  TCGv_vec t1;
  TCGv_vec t0;
  _Bool load_dest_local;
  uint32_t tysz_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_vec_tricore(tcg_ctx,type);
  arg_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  for (local_3c = 0; local_3c < oprsz; local_3c = tysz + local_3c) {
    tcg_gen_ld_vec_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_3c));
    if (load_dest) {
      tcg_gen_ld_vec_tricore(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(dofs + local_3c));
    }
    (*fni)(tcg_ctx,vece,arg_00,arg,c);
    tcg_gen_st_vec_tricore(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(dofs + local_3c));
  }
  tcg_temp_free_vec(tcg_ctx,arg);
  tcg_temp_free_vec(tcg_ctx,arg_00);
  return;
}

Assistant:

static void expand_2i_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                          uint32_t oprsz, uint32_t tysz, TCGType type,
                          int64_t c, bool load_dest,
                          void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec, int64_t))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t1 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        if (load_dest) {
            tcg_gen_ld_vec(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
        }
        fni(tcg_ctx, vece, t1, t0, c);
        tcg_gen_st_vec(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t0);
    tcg_temp_free_vec(tcg_ctx, t1);
}